

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

int store_attrs(ly_ctx *ctx,attr_cont *attrs,lyd_node *first,int options)

{
  lys_node *plVar1;
  int iVar2;
  int local_4c;
  undefined8 *puStack_48;
  uint flag_leaflist;
  lyd_attr *aiter;
  attr_cont *iter;
  lyd_node *diter;
  int options_local;
  lyd_node *first_local;
  attr_cont *attrs_local;
  ly_ctx *ctx_local;
  
  local_4c = 0;
  first_local = (lyd_node *)attrs;
  do {
    if (first_local == (lyd_node *)0x0) {
      return 0;
    }
    plVar1 = first_local->schema;
    iter = (attr_cont *)first;
    if (*(int *)&first_local->next != 0) {
      local_4c = 1;
    }
LAB_00156bc5:
    if (iter == (attr_cont *)0x0) goto LAB_00156c87;
    if (first_local->attr != (lyd_attr *)iter->next) {
LAB_00156c76:
      iter = *(attr_cont **)&iter->index;
      goto LAB_00156bc5;
    }
    if ((local_4c != 0) && (local_4c != *(int *)&first_local->next)) {
      local_4c = local_4c + 1;
      goto LAB_00156c76;
    }
    if (iter->schema != (lys_node *)0x0) {
      ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,iter,
              "attribute (multiple attribute definitions belong to a single element)");
      free(first_local);
      first_local = (lyd_node *)plVar1;
      goto LAB_00156d27;
    }
    iter->schema = *(lys_node **)&first_local->validity;
    for (puStack_48 = *(undefined8 **)&first_local->validity; puStack_48 != (undefined8 *)0x0;
        puStack_48 = (undefined8 *)puStack_48[1]) {
      *puStack_48 = iter;
    }
LAB_00156c87:
    if (iter == (attr_cont *)0x0) {
      ly_vlog(LYE_XML_MISS,LY_VLOG_NONE,(void *)0x0,"element for the specified attribute",
              *(undefined8 *)(*(long *)&first_local->validity + 0x18));
      lyd_free_attr((ly_ctx *)**(undefined8 **)&first_local->attr->value_type,(lyd_node *)0x0,
                    *(lyd_attr **)&first_local->validity,1);
      free(first_local);
      first_local = (lyd_node *)plVar1;
      goto LAB_00156d27;
    }
    free(first_local);
    first_local = (lyd_node *)plVar1;
    if (((options & 8U) != 0) &&
       (iVar2 = lyp_check_edit_attr(ctx,(lyd_attr *)iter->schema,(lyd_node *)iter,(int *)0x0),
       iVar2 != 0)) {
LAB_00156d27:
      while (first_local != (lyd_node *)0x0) {
        plVar1 = first_local->schema;
        lyd_free_attr(ctx,(lyd_node *)0x0,*(lyd_attr **)&first_local->validity,1);
        free(first_local);
        first_local = (lyd_node *)plVar1;
      }
      return -1;
    }
  } while( true );
}

Assistant:

static int
store_attrs(struct ly_ctx *ctx, struct attr_cont *attrs, struct lyd_node *first, int options)
{
    struct lyd_node *diter;
    struct attr_cont *iter;
    struct lyd_attr *aiter;
    unsigned int flag_leaflist = 0;

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        if (iter->index) {
            flag_leaflist = 1;
        }

        LY_TREE_FOR(first, diter) {
            if (iter->schema != diter->schema) {
                continue;
            }

            if (flag_leaflist && flag_leaflist != iter->index) {
                flag_leaflist++;
                continue;
            }

            /* we have match */
            if (diter->attr) {
                LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, diter,
                       "attribute (multiple attribute definitions belong to a single element)");
                free(iter);
                goto error;
            }

            diter->attr = iter->attr;
            for (aiter = iter->attr; aiter; aiter = aiter->next) {
                aiter->parent = diter;
            }

            break;
        }

        if (!diter) {
            LOGVAL(LYE_XML_MISS, LY_VLOG_NONE, NULL, "element for the specified attribute", iter->attr->name);
            lyd_free_attr(iter->schema->module->ctx, NULL, iter->attr, 1);
            free(iter);
            goto error;
        }
        free(iter);

        /* check edit-config attribute correctness */
        if ((options & LYD_OPT_EDIT) && lyp_check_edit_attr(ctx, diter->attr, diter, NULL)) {
            goto error;
        }
    }

    return 0;

error:

    while (attrs) {
        iter = attrs;
        attrs = attrs->next;

        lyd_free_attr(ctx, NULL, iter->attr, 1);
        free(iter);
    }

    return -1;
}